

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::deleteVertexArrays
          (ReferenceContext *this,int numArrays,deUint32 *vertexArrays)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  ulong uVar5;
  bool bVar6;
  
  if (0 < numArrays) {
    p_Var1 = &(this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header;
    uVar5 = 0;
    do {
      uVar2 = vertexArrays[uVar5];
      p_Var3 = (this->m_vertexArrays).m_objects._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_parent;
      p_Var4 = &p_Var1->_M_header;
      if (p_Var3 != (_Base_ptr)0x0 && uVar2 != 0) {
        do {
          bVar6 = (uint)*(size_t *)(p_Var3 + 1) < uVar2;
          if (!bVar6) {
            p_Var4 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[bVar6];
        } while (p_Var3 != (_Base_ptr)0x0);
        if ((((_Rb_tree_header *)p_Var4 != p_Var1) &&
            ((uint)((_Rb_tree_header *)p_Var4)->_M_node_count <= uVar2)) &&
           (*(VertexArray **)((long)p_Var4 + 0x28) != (VertexArray *)0x0)) {
          deleteVertexArray(this,*(VertexArray **)((long)p_Var4 + 0x28));
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)numArrays);
  }
  return;
}

Assistant:

void ReferenceContext::deleteVertexArrays (int numArrays, const deUint32* vertexArrays)
{
	for (int i = 0; i < numArrays; i++)
	{
		deUint32		name		= vertexArrays[i];
		VertexArray*	vertexArray	= name ? m_vertexArrays.find(name) : DE_NULL;

		if (vertexArray)
			deleteVertexArray(vertexArray);
	}
}